

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_expr_kint(CPState *cp,CPValue *k)

{
  long in_RSI;
  long in_RDI;
  CType *ct;
  CType *ct_1;
  undefined4 in_stack_ffffffffffffff78;
  ErrMsg in_stack_ffffffffffffff7c;
  CPState *in_stack_ffffffffffffff80;
  CPState *local_68;
  
  cp_expr_sub(in_stack_ffffffffffffff80,
              (CPValue *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
  for (local_68 = (CPState *)(**(long **)(in_RDI + 0x40) + (ulong)*(uint *)(in_RSI + 4) * 0x10);
      (uint)local_68->c >> 0x1c == 8;
      local_68 = (CPState *)(**(long **)(in_RDI + 0x40) + (ulong)(local_68->c & 0xffff) * 0x10)) {
  }
  if ((local_68->c & 0xfc000000U) != 0) {
    cp_err(local_68,in_stack_ffffffffffffff7c);
  }
  return;
}

Assistant:

static void cp_expr_kint(CPState *cp, CPValue *k)
{
  CType *ct;
  cp_expr_sub(cp, k, 0);
  ct = ctype_raw(cp->cts, k->id);
  if (!ctype_isinteger(ct->info)) cp_err(cp, LJ_ERR_BADVAL);
}